

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

string * __thiscall
fmt::v5::format<unsigned_long,unsigned_long,char,int>
          (string *__return_storage_ptr__,v5 *this,string_view format_str,unsigned_long *args,
          unsigned_long *args_1,char *args_2,int *args_3)

{
  string_view format_str_00;
  format_args args_00;
  format_args local_98;
  v5 *local_88;
  char *local_80;
  undefined1 local_78 [8];
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_unsigned_long,_unsigned_long,_char,_int>
  as;
  char *args_local_2;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  string_view format_str_local;
  
  as.data_[3].field_0.custom.format =
       (_func_void_void_ptr_basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_ptr
        *)args_1;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_unsigned_long,_unsigned_long,_char,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_unsigned_long,_unsigned_long,_char,_int>
                      *)local_78,(unsigned_long *)format_str.size_,args,(char *)args_1,(int *)args_2
                    );
  local_88 = this;
  local_80 = format_str.data_;
  format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long,unsigned_long,char,int>&>
            (&local_98,
             (format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_unsigned_long,_unsigned_long,_char,_int>
              *)local_78);
  format_str_00.size_ =
       local_98.
       super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       .types_;
  format_str_00.data_ = local_80;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)args_1;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = (unsigned_long_long)
            local_98.
            super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            .field_1.values_;
  vformat_abi_cxx11_(__return_storage_ptr__,local_88,format_str_00,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(string_view format_str, const Args & ... args) {
  // This should be just
  // return vformat(format_str, make_format_args(args...));
  // but gcc has trouble optimizing the latter, so break it down.
  format_arg_store<format_context, Args...> as{args...};
  return vformat(format_str, as);
}